

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O3

void __thiscall foxxll::ufs_file_base::~ufs_file_base(ufs_file_base *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

ufs_file_base::~ufs_file_base()
{
    close();
}